

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall QThreadPool::QThreadPool(QThreadPool *this,QObject *parent)

{
  QObjectData *pQVar1;
  QThreadPoolPrivate *this_00;
  QSlotObjectBase *slotObjRaw;
  long in_FS_OFFSET;
  QObject local_38;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPoolPrivate *)operator_new(0x110);
  QThreadPoolPrivate::QThreadPoolPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_006af3d8;
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_38.d_ptr.d = (QObjectData *)QObject::objectNameChanged;
  local_28 = 0;
  slotObjRaw = (QSlotObjectBase *)operator_new(0x18);
  (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  slotObjRaw->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qthreadpool.cpp:445:54),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QObjectData **)(slotObjRaw + 1) = pQVar1;
  QObject::connectImpl
            (&local_38,&this->super_QObject,&local_38.d_ptr.d,&this->super_QObject,(void **)0x0,
             slotObjRaw,AutoConnection,(int *)0x0,&QObject::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QThreadPool::QThreadPool(QObject *parent)
    : QObject(*new QThreadPoolPrivate, parent)
{
    Q_D(QThreadPool);
    connect(this, &QObject::objectNameChanged, this, [d](const QString &newName) {
        // We keep a copy of the name under our own lock, so we can access it thread-safely.
        QMutexLocker locker(&d->mutex);
        d->objectName = newName;
    });
}